

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O0

void __thiscall ixxx::posix::exception_errno_message::test_method(exception_errno_message *this)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  lazy_ostream *plVar5;
  undefined1 local_3f9;
  basic_cstring<const_char> local_3f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3e8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  string local_3a0 [32];
  basic_cstring<const_char> local_380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_370;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  ostringstream local_328 [8];
  ostringstream o;
  sys_error *e;
  exception *e_1;
  undefined1 auStack_b8 [8];
  siginfo_t info;
  string local_30 [7];
  bool caught;
  string message;
  exception_errno_message *this_local;
  
  message.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  info._sifields._pad[0x1b]._3_1_ = 0;
  info._sifields._88_8_ = 0;
  info._sifields._96_8_ = 0;
  info._sifields._72_8_ = 0;
  info._sifields._80_8_ = 0;
  info._sifields._56_8_ = 0;
  info._sifields._64_8_ = 0;
  info._sifields._40_8_ = 0;
  info._sifields._48_8_ = 0;
  info._sifields._sigchld.si_stime = 0;
  info._sifields._32_8_ = 0;
  info._sifields._timer.si_sigval = (__sigval_t)0x0;
  info._sifields._sigchld.si_utime = 0;
  info.si_code = 0;
  info.__pad0 = 0;
  info._sifields._sigfault.si_addr = (void *)0x0;
  auStack_b8._0_4_ = 0;
  auStack_b8._4_4_ = 0;
  info.si_signo = 0;
  info.si_errno = 0;
  waitid(P_PID,0,(siginfo_t *)auStack_b8,4);
  std::__cxx11::ostringstream::ostringstream(local_328);
  poVar3 = std::operator<<((ostream *)local_328,"waitid: ");
  pcVar4 = strerror(0x16);
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3," (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x16);
  std::operator<<(poVar3,')');
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0xa0,&local_348);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_370,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    std::__cxx11::ostringstream::str();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_370,&local_380,0xa0,1,2,local_30,"message",local_3a0,"o.str()");
    std::__cxx11::string::~string(local_3a0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_370);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0xa1,&local_3c0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3e8,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    local_3f9 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_3e8,&local_3f8,0xa1,1,2,(undefined1 *)((long)&info._sifields + 0x6f),"caught",
               &local_3f9,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( exception_errno_message )
    {
      string message;
      bool caught = false;
      try {
        try {
          siginfo_t info = {0};
          posix::waitid(P_PID, 0, &info, WEXITED);
        } catch (const exception &e) {
          message = e.what();
          throw;
        }
      } catch (const ixxx::sys_error &e) {
#if (defined(__APPLE__) && defined(__MACH__))
        BOOST_CHECK_EQUAL(e.code(), ECHILD);
#else
        BOOST_CHECK_EQUAL(e.code(), EINVAL);
#endif
        BOOST_CHECK(e.function() == ixxx::Function::WAITID);
        caught = true;
      }
      ostringstream o;
#if (defined(__APPLE__) && defined(__MACH__))
      o << "waitid: " << strerror(ECHILD) << " (" << ECHILD << ')';
#else
      o << "waitid: " << strerror(EINVAL) << " (" << EINVAL << ')';
#endif
      //BOOST_CHECK_EQUAL(message, "waitid: Invalid argument (22)");
      BOOST_CHECK_EQUAL(message, o.str());
      BOOST_CHECK_EQUAL(caught, true);
    }